

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 GenStateCompileCaseExpr(jx9_gen_state *pGen,jx9_case_expr *pExpr)

{
  SyToken *pSVar1;
  sxi32 sVar2;
  SySet *pContainer;
  int local_3c;
  sxi32 rc;
  sxi32 iNest;
  SyToken *pTmp;
  SyToken *pEnd;
  SySet *pInstrContainer;
  jx9_case_expr *pExpr_local;
  jx9_gen_state *pGen_local;
  
  local_3c = 0;
  for (pTmp = pGen->pIn; pTmp < pGen->pEnd; pTmp = pTmp + 1) {
    if ((pTmp->nType & 0x200) == 0) {
      if ((pTmp->nType & 0x400) == 0) {
        if (((pTmp->nType & 0x140000) != 0) && (local_3c < 1)) break;
      }
      else {
        local_3c = local_3c + -1;
      }
    }
    else {
      local_3c = local_3c + 1;
    }
  }
  if ((pGen->pIn < pTmp) ||
     (sVar2 = jx9GenCompileError(pGen,1,pGen->pIn->nLine,"Empty case expression"), sVar2 != -10)) {
    pSVar1 = pGen->pEnd;
    pGen->pEnd = pTmp;
    pContainer = jx9VmGetByteCodeContainer(pGen->pVm);
    jx9VmSetByteCodeContainer(pGen->pVm,&pExpr->aByteCode);
    sVar2 = jx9CompileExpr(pGen,0,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
    jx9VmEmitInstr(pGen->pVm,1,(uint)(sVar2 != -3),0,(void *)0x0,(sxu32 *)0x0);
    jx9VmSetByteCodeContainer(pGen->pVm,pContainer);
    pGen->pIn = pTmp;
    pGen->pEnd = pSVar1;
    if (sVar2 == -10) {
      pGen_local._4_4_ = -10;
    }
    else {
      pGen_local._4_4_ = 0;
    }
  }
  else {
    pGen_local._4_4_ = -10;
  }
  return pGen_local._4_4_;
}

Assistant:

static sxi32 GenStateCompileCaseExpr(jx9_gen_state *pGen, jx9_case_expr *pExpr)
{
	SySet *pInstrContainer;
	SyToken *pEnd, *pTmp;
	sxi32 iNest = 0;
	sxi32 rc;
	/* Delimit the expression */
	pEnd = pGen->pIn;
	while( pEnd < pGen->pEnd ){
		if( pEnd->nType & JX9_TK_LPAREN /*(*/ ){
			/* Increment nesting level */
			iNest++;
		}else if( pEnd->nType & JX9_TK_RPAREN /*)*/ ){
			/* Decrement nesting level */
			iNest--;
		}else if( pEnd->nType & (JX9_TK_SEMI/*';'*/|JX9_TK_COLON/*;'*/) && iNest < 1 ){
			break;
		}
		pEnd++;
	}
	if( pGen->pIn >= pEnd ){
		rc = jx9GenCompileError(pGen, E_ERROR, pGen->pIn->nLine, "Empty case expression");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
	}
	/* Swap token stream */
	pTmp = pGen->pEnd;
	pGen->pEnd = pEnd;
	pInstrContainer = jx9VmGetByteCodeContainer(pGen->pVm);
	jx9VmSetByteCodeContainer(pGen->pVm, &pExpr->aByteCode);
	rc = jx9CompileExpr(&(*pGen), 0, 0);
	/* Emit the done instruction */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_DONE, (rc != SXERR_EMPTY ? 1 : 0), 0, 0, 0);
	jx9VmSetByteCodeContainer(pGen->pVm, pInstrContainer); 
	/* Update token stream */
	pGen->pIn  = pEnd;
	pGen->pEnd = pTmp;
	if( rc == SXERR_ABORT ){
		return SXERR_ABORT;
	}
	return SXRET_OK;
}